

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O2

int mbedtls_asn1_write_bitstring(uchar **p,uchar *start,uchar *buf,size_t bits)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong __n;
  
  __n = ((bits >> 3) + 1) - (ulong)((bits & 7) == 0);
  puVar1 = *p;
  iVar2 = -0x6c;
  iVar4 = iVar2;
  if ((start <= puVar1) && (__n < (ulong)((long)puVar1 - (long)start))) {
    *p = puVar1 + -__n;
    memcpy(puVar1 + -__n,buf,__n);
    puVar1 = *p;
    *p = puVar1 + -1;
    puVar1[-1] = (char)((int)__n << 3) - (char)bits;
    iVar3 = mbedtls_asn1_write_len(p,start,__n + 1);
    iVar4 = iVar3;
    if ((-1 < iVar3) &&
       (puVar1 = *p, iVar4 = iVar2, puVar1 != start && -1 < (long)puVar1 - (long)start)) {
      *p = puVar1 + -1;
      puVar1[-1] = '\x03';
      iVar4 = (int)(__n + 1) + iVar3 + 1;
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_asn1_write_bitstring( unsigned char **p, unsigned char *start,
                          const unsigned char *buf, size_t bits )
{
    int ret;
    size_t len = 0, size;

    size = ( bits / 8 ) + ( ( bits % 8 ) ? 1 : 0 );

    // Calculate byte length
    //
    if( *p < start || (size_t)( *p - start ) < size + 1 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    len = size + 1;
    (*p) -= size;
    memcpy( *p, buf, size );

    // Write unused bits
    //
    *--(*p) = (unsigned char) (size * 8 - bits);

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_BIT_STRING ) );

    return( (int) len );
}